

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Disassembler.c
# Opt level: O0

_Bool X86_getInstruction(csh ud,uint8_t *code,size_t code_len,MCInst *instr,uint16_t *size,
                        uint64_t address,void *_info)

{
  _Bool _Var1;
  int local_1ac;
  _Bool result;
  uint8_t *puStack_1a8;
  int ret;
  reader_info info;
  InternalInstruction insn;
  cs_struct *handle;
  uint64_t address_local;
  uint16_t *size_local;
  MCInst *instr_local;
  size_t code_len_local;
  uint8_t *code_local;
  csh ud_local;
  
  puStack_1a8 = code;
  info.code = (uint8_t *)code_len;
  info.size = address;
  memset(&info.offset,0,0x98);
  if (instr->flat_insn->detail != (cs_detail *)0x0) {
    (instr->flat_insn->detail->field_6).x86.op_count = '\0';
    (instr->flat_insn->detail->field_6).x86.sse_cc = X86_SSE_CC_INVALID;
    (instr->flat_insn->detail->field_6).x86.avx_cc = X86_AVX_CC_INVALID;
    (instr->flat_insn->detail->field_6).x86.avx_sae = false;
    (instr->flat_insn->detail->field_6).x86.avx_rm = X86_AVX_RM_INVALID;
    memset(&instr->flat_insn->detail->field_6,0,4);
    memset((void *)((long)&instr->flat_insn->detail->field_6 + 4),0,4);
    memset((void *)((long)&instr->flat_insn->detail->field_6 + 0x30),0,0x180);
  }
  if ((*(uint *)(ud + 4) & 2) == 0) {
    if ((*(uint *)(ud + 4) & 4) == 0) {
      local_1ac = decodeInstruction((InternalInstruction *)&info.offset,reader,
                                    &stack0xfffffffffffffe58,address,MODE_64BIT);
    }
    else {
      local_1ac = decodeInstruction((InternalInstruction *)&info.offset,reader,
                                    &stack0xfffffffffffffe58,address,MODE_32BIT);
    }
  }
  else {
    local_1ac = decodeInstruction((InternalInstruction *)&info.offset,reader,
                                  &stack0xfffffffffffffe58,address,MODE_16BIT);
  }
  if (local_1ac == 0) {
    *size = (uint16_t)insn.startLocation;
    _Var1 = translateInstruction(instr,(InternalInstruction *)&info.offset);
    ud_local._7_1_ = ((_Var1 ^ 0xffU) & 1) != 0;
    if (ud_local._7_1_) {
      instr->imm_size = insn.necessaryPrefixLocation._4_1_;
      if (*(int *)(ud + 0x68) == 0) {
        instr->x86_prefix[0] = info.offset._1_1_;
        instr->x86_prefix[1] = info.offset._2_1_;
        instr->x86_prefix[2] = info.offset._3_1_;
        instr->x86_prefix[3] = info.offset._4_1_;
      }
      else {
        update_pub_insn(instr->flat_insn,(InternalInstruction *)&info.offset,instr->x86_prefix);
      }
    }
  }
  else {
    *size = (short)insn.readerArg - (short)address;
    ud_local._7_1_ = false;
  }
  return ud_local._7_1_;
}

Assistant:

bool X86_getInstruction(csh ud, const uint8_t *code, size_t code_len,
		MCInst *instr, uint16_t *size, uint64_t address, void *_info)
{
	cs_struct *handle = (cs_struct *)(uintptr_t)ud;
	InternalInstruction insn;
	struct reader_info info;
	int ret;
	bool result;

	info.code = code;
	info.size = code_len;
	info.offset = address;

	memset(&insn, 0, offsetof(InternalInstruction, reader));

	if (instr->flat_insn->detail) {
		instr->flat_insn->detail->x86.op_count = 0;
		instr->flat_insn->detail->x86.sse_cc = X86_SSE_CC_INVALID;
		instr->flat_insn->detail->x86.avx_cc = X86_AVX_CC_INVALID;
		instr->flat_insn->detail->x86.avx_sae = false;
		instr->flat_insn->detail->x86.avx_rm = X86_AVX_RM_INVALID;

		memset(instr->flat_insn->detail->x86.prefix, 0, sizeof(instr->flat_insn->detail->x86.prefix));
		memset(instr->flat_insn->detail->x86.opcode, 0, sizeof(instr->flat_insn->detail->x86.opcode));
		memset(instr->flat_insn->detail->x86.operands, 0, sizeof(instr->flat_insn->detail->x86.operands));
	}

	if (handle->mode & CS_MODE_16)
		ret = decodeInstruction(&insn,
				reader, &info,
				address,
				MODE_16BIT);
	else if (handle->mode & CS_MODE_32)
		ret = decodeInstruction(&insn,
				reader, &info,
				address,
				MODE_32BIT);
	else
		ret = decodeInstruction(&insn,
				reader, &info,
				address,
				MODE_64BIT);

	if (ret) {
		*size = (uint16_t)(insn.readerCursor - address);

		return false;
	} else {
		*size = (uint16_t)insn.length;

		result = (!translateInstruction(instr, &insn)) ?  true : false;
		if (result) {
			instr->imm_size = insn.immSize;
			if (handle->detail) {
				update_pub_insn(instr->flat_insn, &insn, instr->x86_prefix);
			} else {
				// still copy all prefixes
				instr->x86_prefix[0] = insn.prefix0;
				instr->x86_prefix[1] = insn.prefix1;
				instr->x86_prefix[2] = insn.prefix2;
				instr->x86_prefix[3] = insn.prefix3;
			}
		}

		return result;
	}
}